

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
               *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  long lVar3;
  long lVar4;
  
  if ((this->_has_bits_[0] & 1) == 0) {
    lVar4 = 0;
  }
  else {
    iVar1 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])(this);
    uVar2 = *(ulong *)CONCAT44(extraout_var,iVar1) | 1;
    lVar4 = 0x3f;
    if (uVar2 != 0) {
      for (; uVar2 >> lVar4 == 0; lVar4 = lVar4 + -1) {
      }
    }
    lVar4 = (ulong)((int)lVar4 * 9 + 0x49U >> 6) + 1;
  }
  if ((this->_has_bits_[0] & 2) == 0) {
    lVar3 = 0;
  }
  else {
    (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
    lVar3 = 9;
  }
  return lVar3 + lVar4;
}

Assistant:

size_t ByteSizeLong() const {
    size_t size = 0;
    size += has_key() ? kTagSize + KeyTypeHandler::ByteSize(key()) : 0;
    size += has_value() ? kTagSize + ValueTypeHandler::ByteSize(value()) : 0;
    return size;
  }